

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AV1SelfguidedFilterTest_CorrectnessTest_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::AV1SelfguidedFilterTest_CorrectnessTest_Test>
           *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int)>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x20);
  anon_unknown.dwarf_2520fc::AV1SelfguidedFilterTest_CorrectnessTest_Test::
  AV1SelfguidedFilterTest_CorrectnessTest_Test
            ((AV1SelfguidedFilterTest_CorrectnessTest_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }